

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

SourceContextInfo * __thiscall
Js::ScriptContext::CreateSourceContextInfo
          (ScriptContext *this,uint hash,DWORD_PTR hostSourceContext)

{
  Type *addr;
  JavascriptLibrary *pJVar1;
  BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  uint uVar3;
  SourceContextInfo *pSVar4;
  Recycler *alloc;
  SourceDynamicProfileManager *pSVar5;
  undefined **local_60;
  SourceContextInfo *sourceContextInfo;
  size_t local_50;
  char *local_48;
  DWORD local_40;
  uint local_34 [2];
  uint hash_local;
  
  local_34[0] = hash;
  EnsureDynamicSourceContextInfoMap(this);
  pSVar4 = GetSourceContextInfo(this,local_34[0]);
  pJVar1 = (this->super_ScriptContextBase).javascriptLibrary;
  if (pSVar4 == (SourceContextInfo *)0x0) {
    pBVar2 = (pJVar1->cache).dynamicSourceContextInfoMap.ptr;
    if (pBVar2->count - pBVar2->freeCount < 0x33) {
      local_60 = &SourceContextInfo::typeinfo;
      sourceContextInfo = (SourceContextInfo *)0x0;
      local_50 = 0xffffffffffffffff;
      local_48 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
      ;
      local_40 = 0xbc9;
      alloc = Memory::Recycler::TrackAllocInfo
                        (this->recycler,(TrackAllocData *)&stack0xffffffffffffffa0);
      local_60 = (undefined **)new<Memory::Recycler>(0x38,alloc,0x572640);
      (((SourceContextInfo *)local_60)->sourceDynamicProfileManager).ptr =
           (SourceDynamicProfileManager *)0x0;
      uVar3 = GetNextSourceContextId(this);
      ((SourceContextInfo *)local_60)->sourceContextId = uVar3;
      ((SourceContextInfo *)local_60)->dwHostSourceContext = hostSourceContext;
      ((SourceContextInfo *)local_60)->isHostDynamicDocument = true;
      (((SourceContextInfo *)local_60)->field_5).hash = local_34[0];
      pSVar5 = ThreadContext::GetSourceDynamicProfileManager
                         (this->threadContext,this->url,local_34[0],
                          &this->referencesSharedDynamicSourceContextInfo);
      pSVar4 = (SourceContextInfo *)local_60;
      addr = &((SourceContextInfo *)local_60)->sourceDynamicProfileManager;
      Memory::Recycler::WBSetBit((char *)addr);
      (pSVar4->sourceDynamicProfileManager).ptr = pSVar5;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      if (hostSourceContext == 0xffffffffffffffff) {
        JsUtil::
        BaseDictionary<unsigned_int,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<unsigned_int,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)(((this->super_ScriptContextBase).javascriptLibrary)->cache).
                      dynamicSourceContextInfoMap.ptr,local_34,
                   (SourceContextInfo **)&stack0xffffffffffffffa0);
      }
    }
    else {
      Output::Trace(DynamicProfilePhase,L"Max of dynamic script profile info reached.\n");
      local_60 = (undefined **)
                 (((this->super_ScriptContextBase).javascriptLibrary)->cache).
                 noContextSourceContextInfo.ptr;
    }
  }
  else {
    local_60 = (undefined **)(pJVar1->cache).noContextSourceContextInfo.ptr;
  }
  return (SourceContextInfo *)local_60;
}

Assistant:

SourceContextInfo* ScriptContext::CreateSourceContextInfo(uint hash, DWORD_PTR hostSourceContext)
    {
        EnsureDynamicSourceContextInfoMap();
        if (this->GetSourceContextInfo(hash) != nullptr)
        {
            return this->Cache()->noContextSourceContextInfo;
        }

        if (this->Cache()->dynamicSourceContextInfoMap->Count() > INMEMORY_CACHE_MAX_PROFILE_MANAGER)
        {
            OUTPUT_TRACE(Js::DynamicProfilePhase, _u("Max of dynamic script profile info reached.\n"));
            return this->Cache()->noContextSourceContextInfo;
        }

        // This is capped so we can continue allocating in the arena
        SourceContextInfo * sourceContextInfo = RecyclerNewStructZ(this->GetRecycler(), SourceContextInfo);
        sourceContextInfo->sourceContextId = this->GetNextSourceContextId();
        sourceContextInfo->dwHostSourceContext = hostSourceContext;
        sourceContextInfo->isHostDynamicDocument = true;
        sourceContextInfo->hash = hash;
#if ENABLE_PROFILE_INFO
        sourceContextInfo->sourceDynamicProfileManager = this->threadContext->GetSourceDynamicProfileManager(this->GetUrl(), hash, &referencesSharedDynamicSourceContextInfo);
#endif

        // For the host provided dynamic code (if hostSourceContext is not NoHostSourceContext), do not add to dynamicSourceContextInfoMap
        if (hostSourceContext == Js::Constants::NoHostSourceContext)
        {
            this->Cache()->dynamicSourceContextInfoMap->Add(hash, sourceContextInfo);
        }
        return sourceContextInfo;
    }